

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmmap.c
# Opt level: O0

anmmap_t * anmmap_new(void)

{
  anmmap_t *paVar1;
  seqmap_t *psVar2;
  anmmap_t *map;
  
  paVar1 = (anmmap_t *)malloc(0x18);
  if (paVar1 != (anmmap_t *)0x0) {
    psVar2 = seqmap_new();
    paVar1->ins_names = psVar2;
    psVar2 = seqmap_new();
    paVar1->gvar_names = psVar2;
    psVar2 = seqmap_new();
    paVar1->gvar_types = psVar2;
  }
  return paVar1;
}

Assistant:

anmmap_t*
anmmap_new() {
    anmmap_t* map = (anmmap_t*)malloc(sizeof(anmmap_t));
    if (map) {
        map->ins_names = seqmap_new();
        map->gvar_names = seqmap_new();
        map->gvar_types = seqmap_new();
    }
    return map;
}